

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void on_request(http_s *request)

{
  int iVar1;
  fio_str_info_s local_28;
  http_s *local_10;
  http_s *request_local;
  
  local_10 = request;
  fiobj_obj2cstr(&local_28,request->method);
  iVar1 = strcmp("POST",local_28.data);
  if (iVar1 == 0) {
    iVar1 = request_contains_shutdown_token(local_10);
    if (iVar1 == 0) {
      http_send_body(local_10,"{\"status\": -1}\r\n",0x10);
    }
    else {
      http_send_body(local_10,"{\"status\": 0}\r\n",0xf);
      log_log(2,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/src/main.c"
              ,0x47,"Shutting down!");
      system("sudo shutdown -h now");
    }
  }
  else {
    http_send_body(local_10,"{\"status\": 1}\r\n",0xf);
  }
  return;
}

Assistant:

void on_request(http_s *request) {
  /* honour non-POST requests with HTTP 200 */
  if (strcmp("POST", fiobj_obj2cstr(request->method).data)) {
    http_send_body(request, "{\"status\": 1}\r\n", 15);
    return;
  }

  /* shutdown only if body is JSON object {"token": "<RSHUTDOWN_TOKEN_ENV_VAR>"} */
  if (request_contains_shutdown_token(request)) {
      http_send_body(request, "{\"status\": 0}\r\n", 15);
#ifdef NO_SHUTDOWN
      log_info("NO_SHUTDOWN set - not shutting down");
#else
      log_info("Shutting down!");
      system("sudo shutdown -h now");
#endif
  }
  else {
      http_send_body(request, "{\"status\": -1}\r\n", 16);
  }
}